

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
::
_multiply_source_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
          (Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
           *this,Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                 *column,Field_element *val)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  local_78;
  anon_class_8_1_d68037b6 local_60;
  anon_class_8_1_d68037b6 local_58;
  anon_class_16_2_633bb64e local_50;
  anon_class_24_3_4302cb62 local_40;
  
  if (*val != 0) {
    ppEVar1 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar1 != ppEVar2) {
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
      ::reserve((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
                 *)&local_78,
                (((long)ppEVar2 - (long)ppEVar1 >> 3) -
                (column->erasedValues_)._M_h._M_element_count) +
                (*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3));
      local_60.newColumn = (Column_support *)&local_78;
      local_58.newColumn = (Column_support *)&local_78;
      local_50.this =
           (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
            *)this;
      local_50.val = val;
      local_40.newColumn = (Column_support *)&local_78;
      local_40.this =
           (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
            *)this;
      local_40.val = val;
      bVar4 = _generic_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>(Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>const&,unsigned_int_const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>::_multiply_source_and_add<Gudhi::persistence_matrix::Vector_col___ini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>*)_2_>
                        (this,column,&local_58,&local_40,&local_50,&local_60);
      ppEVar1 = *(pointer *)(this + 0x20);
      *(pointer *)(this + 0x20) = local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
      ppEVar2 = *(pointer *)(this + 0x10);
      ppEVar3 = *(pointer *)(this + 0x18);
      *(pointer *)(this + 0x10) = local_78._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(this + 0x18) = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_78._M_impl.super__Vector_impl_data._M_start = ppEVar2;
      local_78._M_impl.super__Vector_impl_data._M_finish = ppEVar3;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar1;
      std::
      _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
      ::~_Vector_base(&local_78);
      return bVar4;
    }
  }
  return false;
}

Assistant:

inline bool Vector_column<Master_matrix>::_multiply_source_and_add(const Entry_range& column, const Field_element& val)
{
  if (val == 0u || column.begin() == column.end()) {
    return false;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add(
      column,
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Entry_range::const_iterator& itSource, const typename Column_support::iterator& itTarget) {
        Entry* newEntry = _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
        operators_->multiply_inplace(newEntry->get_element(), val);
        if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*newEntry);
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        operators_->multiply_and_add_inplace_back(itSource->get_element(), val, targetElement);
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); }
    );

  column_.swap(newColumn);

  return pivotIsZeroed;
}